

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O2

void __thiscall Person::setAddress(Person *this,Address *address)

{
  Address::operator=(&this->address,address);
  return;
}

Assistant:

void Person::setAddress(const Address &address) {

    Person::address = address;
}